

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void * worker_thread_get(void *arg)

{
  FILE *__stream;
  long lVar1;
  undefined8 uVar2;
  undefined1 local_148 [8];
  char vbuf [256];
  undefined8 local_40;
  size_t vsize;
  
  local_40 = 0;
  vsize = 1;
  while( true ) {
    if (*(uint *)((long)arg + 0x1c) <= vsize) {
      return (void *)0x0;
    }
    lVar1 = vmemcache_get(*(undefined8 *)((long)arg + 8),&vsize,8,local_148,0x100,0,&local_40);
    if (lVar1 == -1) break;
    vsize = vsize + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x88,"worker_thread_get");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_get: %s",uVar2);
  fputc(10,_stderr);
  abort();
}

Assistant:

static void *
worker_thread_get(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;

	char vbuf[BUF_SIZE];		/* user-provided buffer */
	size_t vbufsize = BUF_SIZE;	/* size of vbuf */
	size_t vsize = 0;		/* real size of the object */

	/* starting from 1, because the entry #0 has been evicted */
	for (i = 1; i < ctx->ops_count; i++) {
		if (vmemcache_get(ctx->cache, &i, sizeof(i),
					vbuf, vbufsize, 0, &vsize) == -1)
			UT_FATAL("ERROR: vmemcache_get: %s",
					vmemcache_errormsg());
	}

	return NULL;
}